

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

int Fx_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nNewNodesMax,int LitCountMax,int fCanonDivs,
                  int fVerbose,int fVeryVerbose)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  int iDiv;
  Vec_Que_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  void *__ptr;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  Fx_Man_t *p;
  long lVar10;
  int *piVar11;
  uint uVar12;
  abctime aVar13;
  float *extraout_RDX;
  float *fWarning;
  uint uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  timespec local_50;
  int local_40;
  int local_3c;
  long local_38;
  
  local_40 = fVerbose;
  local_3c = nNewNodesMax;
  iVar8 = clock_gettime(3,&local_50);
  if (iVar8 < 0) {
    local_38 = -1;
  }
  else {
    local_38 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p = Fx_ManStart(vCubes);
  p->LitCountMax = LitCountMax;
  p->fCanonDivs = fCanonDivs;
  Fx_ManCreateLiterals(p,ObjIdMax);
  Fx_ManComputeLevel(p);
  Fx_ManCreateDivisors(p);
  if ((fVeryVerbose != 0) && (0 < p->vWeights->nSize)) {
    iVar8 = 0;
    do {
      Fx_PrintDiv(p,iVar8);
      iVar8 = iVar8 + 1;
    } while (iVar8 < p->vWeights->nSize);
  }
  iVar8 = local_3c;
  if (local_40 != 0) {
    iVar9 = clock_gettime(3,&local_50);
    if (iVar9 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Fx_PrintStats(p,lVar15 - local_38);
  }
  iVar9 = clock_gettime(3,&local_50);
  if (iVar9 < 0) {
    aVar13 = -1;
  }
  else {
    aVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeStart = aVar13;
  if (0 < iVar8) {
    iVar9 = 0;
    do {
      pVVar3 = p->vPrio;
      if (pVVar3->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      if (pVVar3->nSize == 1) break;
      piVar11 = pVVar3->pHeap;
      iDiv = piVar11[1];
      fWarning = *pVVar3->pCostsFlt;
      if (fWarning == (float *)0x0) {
        fVar20 = (float)iDiv;
      }
      else {
        fVar20 = fWarning[iDiv];
      }
      if (fVar20 <= 0.0) break;
      piVar4 = pVVar3->pOrder;
      piVar4[iDiv] = -1;
      iVar16 = pVVar3->nSize;
      pVVar3->nSize = iVar16 + -1;
      if (iVar16 + -1 == 1) {
        piVar11[1] = -1;
      }
      else {
        iVar8 = piVar11[(long)iVar16 + -1];
        piVar11[(long)iVar16 + -1] = -1;
        piVar11[1] = iVar8;
        piVar4[iVar8] = 1;
        if (fWarning == (float *)0x0) {
          fVar20 = (float)iVar8;
        }
        else {
          fVar20 = fWarning[iVar8];
        }
        iVar16 = pVVar3->nSize;
        uVar14 = 1;
        if (2 < iVar16) {
          uVar12 = 2;
          uVar14 = 1;
          do {
            uVar18 = uVar12 | 1;
            uVar17 = uVar12;
            if ((int)uVar18 < iVar16) {
              if (fWarning == (float *)0x0) {
                fVar21 = (float)piVar11[(int)uVar12];
                fVar22 = (float)piVar11[(int)uVar18];
              }
              else {
                fVar21 = fWarning[piVar11[(int)uVar12]];
                fVar22 = fWarning[piVar11[(int)uVar18]];
              }
              if (fVar21 < fVar22) {
                uVar17 = uVar18;
              }
            }
            if (iVar16 <= (int)uVar17) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar16 = piVar11[(int)uVar17];
            if (fWarning == (float *)0x0) {
              fVar21 = (float)iVar16;
            }
            else {
              fVar21 = fWarning[iVar16];
            }
            if (fVar21 <= fVar20) break;
            piVar11[(int)uVar14] = iVar16;
            piVar4[iVar16] = uVar14;
            uVar12 = uVar17 * 2;
            iVar16 = pVVar3->nSize;
            uVar14 = uVar17;
          } while ((int)uVar12 < iVar16);
        }
        piVar11[(int)uVar14] = iVar8;
        piVar4[iVar8] = uVar14;
        iVar8 = local_3c;
      }
      if (fVeryVerbose != 0) {
        Fx_PrintDiv(p,iDiv);
        fWarning = extraout_RDX;
      }
      Fx_ManUpdate(p,iDiv,(int *)fWarning);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar8);
  }
  if (local_40 != 0) {
    iVar8 = clock_gettime(3,&local_50);
    if (iVar8 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Fx_PrintStats(p,lVar15 - local_38);
  }
  Fx_ManStop(p);
  iVar8 = vCubes->nSize;
  if (iVar8 < 1) {
    uVar14 = 0;
  }
  else {
    lVar15 = 0;
    lVar19 = 8;
    uVar14 = 0;
    do {
      pVVar5 = vCubes->pArray;
      if (*(int *)((long)pVVar5 + lVar19 + -4) < 1) {
        __ptr = *(void **)((long)&pVVar5->nCap + lVar19);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&pVVar5->nCap + lVar19) = 0;
        }
      }
      else {
        puVar1 = (undefined4 *)((long)&pVVar5->nCap + lVar19);
        lVar10 = (long)(int)uVar14;
        uVar14 = uVar14 + 1;
        iVar8 = puVar1[-1];
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        pVVar5 = pVVar5 + lVar10;
        pVVar5->nCap = puVar1[-2];
        pVVar5->nSize = iVar8;
        *(undefined4 *)&pVVar5->pArray = uVar6;
        *(undefined4 *)((long)&pVVar5->pArray + 4) = uVar7;
      }
      lVar15 = lVar15 + 1;
      iVar8 = vCubes->nSize;
      lVar19 = lVar19 + 0x10;
    } while (lVar15 < iVar8);
    if ((int)uVar14 < iVar8) {
      if ((int)uVar14 < 0) goto LAB_002c99f8;
      lVar15 = (ulong)uVar14 << 4;
      uVar12 = uVar14;
      do {
        puVar2 = (undefined8 *)((long)&vCubes->pArray->nCap + lVar15);
        *puVar2 = 0;
        puVar2[1] = 0;
        iVar8 = vCubes->nSize;
        uVar12 = uVar12 + 1;
        lVar15 = lVar15 + 0x10;
      } while ((int)uVar12 < iVar8);
    }
    if ((int)uVar14 < iVar8) {
      if ((int)uVar14 < 0) {
LAB_002c99f8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      piVar11 = &vCubes->pArray[uVar14].nSize;
      uVar12 = uVar14;
      do {
        if (*piVar11 < 0) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        *piVar11 = 0;
        uVar12 = uVar12 + 1;
        piVar11 = piVar11 + 4;
      } while ((int)uVar12 < iVar8);
    }
  }
  if (iVar8 < (int)uVar14) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0xff,"void Vec_WecShrink(Vec_Wec_t *, int)");
  }
  vCubes->nSize = uVar14;
  return 1;
}

Assistant:

int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose )
{
    int fVeryVeryVerbose = 0;
    int i, iDiv, fWarning = 0;
    Fx_Man_t * p;
    abctime clk = Abc_Clock();
    // initialize the data-structure
    p = Fx_ManStart( vCubes );
    p->LitCountMax = LitCountMax;
    p->fCanonDivs = fCanonDivs;
    Fx_ManCreateLiterals( p, ObjIdMax );
    Fx_ManComputeLevel( p );
    Fx_ManCreateDivisors( p );
    if ( fVeryVerbose )
        Fx_PrintDivisors( p );
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    // perform extraction
    p->timeStart = Abc_Clock();
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vPrio) > 0.0; i++ )
    {
        iDiv = Vec_QuePop(p->vPrio);
        if ( fVeryVerbose )
            Fx_PrintDiv( p, iDiv );
        Fx_ManUpdate( p, iDiv, &fWarning );
        if ( fVeryVeryVerbose )
            Fx_PrintDivisors( p );
    }
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    Fx_ManStop( p );
    // return the result
    Vec_WecRemoveEmpty( vCubes );
    return 1;
}